

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O3

bool Internal_IgnoreSavedLimitPointList(ON_BinaryArchive *archive,uint vertex_face_count)

{
  bool bVar1;
  long lVar2;
  ON_SubDSectorSurfacePoint *pOVar3;
  double *pdVar4;
  uint uVar5;
  byte bVar6;
  uchar c;
  uint limit_point_count;
  ON_SubDSectorSurfacePoint limit_point;
  ON__UINT8 local_ad;
  ON__UINT32 local_ac;
  ON__UINT_PTR local_a8;
  double local_a0 [3];
  double local_88 [3];
  double local_70 [3];
  double local_58 [5];
  
  bVar6 = 0;
  local_ad = '\0';
  bVar1 = ON_BinaryArchive::ReadChar(archive,&local_ad);
  if (bVar1) {
    if (local_ad == '\0') {
      return true;
    }
    local_ac = 0;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&local_ac);
    if ((bVar1) && (local_ac - 1 < vertex_face_count)) {
      uVar5 = 0;
      while( true ) {
        pOVar3 = &ON_SubDSectorSurfacePoint::Unset;
        pdVar4 = local_a0;
        for (lVar2 = 0xe; lVar2 != 0; lVar2 = lVar2 + -1) {
          *pdVar4 = pOVar3->m_limitP[0];
          pOVar3 = (ON_SubDSectorSurfacePoint *)((long)pOVar3 + ((ulong)bVar6 * -2 + 1) * 8);
          pdVar4 = pdVar4 + (ulong)bVar6 * -2 + 1;
        }
        bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_a0);
        if ((((!bVar1) || (bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_88), !bVar1)) ||
            (bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_70), !bVar1)) ||
           (bVar1 = ON_BinaryArchive::ReadDouble(archive,3,local_58), !bVar1)) break;
        bVar1 = Internal_ReadArchiveIdAndFlagsIntoComponentPtr(archive,&local_a8);
        if ((!bVar1) || (uVar5 = uVar5 + 1, local_ac <= uVar5)) goto LAB_005f69e5;
      }
      ON_SubDIncrementErrorCount();
LAB_005f69e5:
      if (local_ac == uVar5) {
        return true;
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

static bool Internal_IgnoreSavedLimitPointList(
  ON_BinaryArchive& archive,
  unsigned int vertex_face_count
  //ON_SimpleArray< ON_SubDSectorSurfacePoint > limit_points // NOTE MISSING & means this array was by value and not by reference
  )
{
  //limit_points.SetCount(0);

  for (;;)
  {
    unsigned char c = 0;
    if (!archive.ReadChar(&c))
      break;

    if ( 0 == c)
      return true;

    unsigned int limit_point_count = 0;
    if (!archive.ReadInt(&limit_point_count))
      break;

    if ( 0 == limit_point_count )
      break;

    if (limit_point_count > vertex_face_count)
      break;

    //limit_points.Reserve(limit_point_count);
    unsigned int i = 0;
    for ( /*empty init*/; i < limit_point_count; i++)
    {
      ON_SubDSectorSurfacePoint limit_point = ON_SubDSectorSurfacePoint::Unset;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitP))
        break;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitT1))
        break;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitT2))
        break;
      if (!Internal_ReadDouble3(archive,limit_point.m_limitN))
        break;
      ON_SubDFacePtr fptr = ON_SubDFacePtr::Null;
      if (!Internal_ReadArchiveIdAndFlagsIntoComponentPtr(archive,fptr.m_ptr))
        break;
      //limit_points.Append(limit_point);
    }

    if (limit_point_count != i )
      break;

    //if (4 != c)
    //  limit_points.SetCount(0);

    return true;
  }
  return ON_SUBD_RETURN_ERROR(false);
}